

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

void __thiscall QWidgetLineControl::clear(QWidgetLineControl *this)

{
  int validateFromState;
  
  validateFromState = *(int *)(this + 0xf4);
  *(undefined4 *)(this + 0x110) = 0;
  *(undefined4 *)(this + 0x114) = *(undefined4 *)(this + 0x28);
  removeSelectedText(this);
  this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 2);
  finishChange(this,validateFromState,false,false);
  return;
}

Assistant:

void QWidgetLineControl::clear()
{
    int priorState = m_undoState;
    m_selstart = 0;
    m_selend = m_text.size();
    removeSelectedText();
    separate();
    finishChange(priorState, /*update*/false, /*edited*/false);
}